

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

void N_VScale_Serial(realtype c,N_Vector x,N_Vector z)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (z == x) {
    lVar4 = (long)*x->content;
    if (0 < lVar4) {
      lVar2 = *(long *)((long)x->content + 8);
      lVar6 = 0;
      do {
        *(double *)(lVar2 + lVar6 * 8) = *(double *)(lVar2 + lVar6 * 8) * c;
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
  }
  else if ((c != 1.0) || (NAN(c))) {
    piVar3 = (int *)x->content;
    if ((c != -1.0) || (NAN(c))) {
      iVar1 = *piVar3;
      if (0 < (long)iVar1) {
        lVar4 = *(long *)(piVar3 + 2);
        lVar2 = *(long *)((long)z->content + 8);
        lVar6 = 0;
        do {
          *(double *)(lVar2 + lVar6 * 8) = *(double *)(lVar4 + lVar6 * 8) * c;
          lVar6 = lVar6 + 1;
        } while (iVar1 != lVar6);
      }
    }
    else {
      iVar1 = *piVar3;
      if (0 < (long)iVar1) {
        lVar4 = *(long *)(piVar3 + 2);
        lVar2 = *(long *)((long)z->content + 8);
        lVar6 = 0;
        do {
          *(ulong *)(lVar2 + lVar6 * 8) = *(ulong *)(lVar4 + lVar6 * 8) ^ 0x8000000000000000;
          lVar6 = lVar6 + 1;
        } while (iVar1 != lVar6);
      }
    }
  }
  else {
    lVar4 = (long)*x->content;
    if (0 < lVar4) {
      lVar2 = *(long *)((long)x->content + 8);
      lVar6 = *(long *)((long)z->content + 8);
      lVar5 = 0;
      do {
        *(undefined8 *)(lVar6 + lVar5 * 8) = *(undefined8 *)(lVar2 + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  return;
}

Assistant:

void N_VScale_Serial(realtype c, N_Vector x, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *zd;

  xd = zd = NULL;

  if (z == x) {  /* BLAS usage: scale x <- cx */
    VScaleBy_Serial(c, x);
    return;
  }

  if (c == ONE) {
    VCopy_Serial(x, z);
  } else if (c == -ONE) {
    VNeg_Serial(x, z);
  } else {
    N  = NV_LENGTH_S(x);
    xd = NV_DATA_S(x);
    zd = NV_DATA_S(z);
    for (i = 0; i < N; i++)
      zd[i] = c*xd[i];
  }

  return;
}